

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pingpong.c
# Opt level: O1

CURLcode Curl_pp_readresp(curl_socket_t sockfd,pingpong *pp,int *code,size_t *size)

{
  long *plVar1;
  SessionHandle *data;
  bool bVar2;
  connectdata *conn;
  _Bool _Var3;
  CURLcode CVar4;
  CURLcode CVar5;
  ulong uVar6;
  char *__dest;
  size_t sVar7;
  char *buf;
  bool bVar8;
  long lVar9;
  long lVar10;
  size_t size_00;
  size_t __n;
  bool bVar11;
  ssize_t gotbytes;
  CURLcode local_70;
  size_t local_60;
  curl_socket_t local_54;
  char *local_50;
  connectdata *local_48;
  size_t *local_40;
  int *local_38;
  
  local_48 = pp->conn;
  data = local_48->data;
  *code = 0;
  *size = 0;
  uVar6 = pp->nread_resp;
  CVar5 = CURLE_OK;
  if (uVar6 < 0x4000) {
    local_50 = (data->state).buffer;
    buf = local_50 + pp->nread_resp;
    size_00 = (long)buf - (long)pp->linestart_resp;
    bVar8 = true;
    CVar5 = CURLE_OK;
    local_54 = sockfd;
    local_40 = size;
    local_38 = code;
    do {
      if (pp->cache == (char *)0x0) {
        CVar4 = Curl_read(local_48,local_54,buf,0x4000 - uVar6,(ssize_t *)&local_60);
        if (CVar4 == CURLE_AGAIN) {
          return CURLE_OK;
        }
        CVar5 = CVar4;
        if (0 < (long)local_60) {
          CVar5 = CURLE_OK;
        }
        if (CVar4 != CURLE_OK) {
          CVar5 = CVar4;
        }
        if (CVar5 != CURLE_OK) {
          bVar8 = false;
        }
      }
      else {
        memcpy(buf,pp->cache,pp->cache_size);
        local_60 = pp->cache_size;
        (*Curl_cfree)(pp->cache);
        pp->cache = (char *)0x0;
        pp->cache_size = 0;
      }
      if (bVar8) {
        if ((long)local_60 < 1) {
          bVar8 = false;
          Curl_failf(data,"response reading failed");
          CVar5 = CURLE_RECV_ERROR;
        }
        else {
          plVar1 = &(data->req).headerbytecount;
          *plVar1 = *plVar1 + local_60;
          pp->nread_resp = pp->nread_resp + local_60;
          if ((long)local_60 < 1) {
            lVar9 = 0;
          }
          else {
            lVar9 = 1;
            lVar10 = 0;
            do {
              conn = local_48;
              size_00 = size_00 + 1;
              if (buf[lVar10] == '\n') {
                if ((data->set).verbose == true) {
                  Curl_debug(data,CURLINFO_HEADER_IN,pp->linestart_resp,size_00,local_48);
                }
                CVar5 = Curl_client_write(conn,2,pp->linestart_resp,size_00);
                if (CVar5 != CURLE_OK) {
                  buf = buf + lVar10;
                  bVar2 = false;
                  local_70 = CVar5;
                  goto LAB_00583816;
                }
                _Var3 = (*pp->endofresp)(conn,pp->linestart_resp,size_00,local_38);
                if (_Var3) {
                  __n = (long)(buf + lVar10) - (long)pp->linestart_resp;
                  memmove(local_50,pp->linestart_resp,__n);
                  *(undefined1 *)(__n + 0x890 + (long)data) = 0;
                  pp->linestart_resp = buf + lVar9;
                  *local_40 = pp->nread_resp;
                  pp->nread_resp = 0;
                  bVar8 = false;
                  CVar5 = CURLE_OK;
                  buf = buf + lVar10;
                  goto LAB_00583765;
                }
                pp->linestart_resp = buf + lVar9;
                size_00 = 0;
                CVar5 = CURLE_OK;
              }
              lVar10 = lVar10 + 1;
              lVar9 = lVar9 + 1;
            } while (lVar10 < (long)local_60);
            buf = buf + lVar10;
            lVar9 = lVar10;
          }
LAB_00583765:
          if (bVar8) {
            if ((long)local_60 < 0x2001 || size_00 != local_60) {
              bVar11 = 0x2000 < pp->nread_resp;
              sVar7 = 0;
              if (bVar11) {
                sVar7 = size_00;
              }
            }
            else {
              Curl_infof(data,
                         "Excessive server response line length received, %zd bytes. Stripping\n");
              bVar11 = true;
              sVar7 = 0x28;
            }
          }
          else {
            sVar7 = local_60 - lVar9;
            bVar11 = true;
          }
          if (sVar7 == 0) {
LAB_005837ef:
            bVar2 = true;
            if (bVar11) {
              pp->nread_resp = 0;
              pp->linestart_resp = local_50;
              size_00 = 0;
              buf = local_50;
            }
          }
          else {
            pp->cache_size = sVar7;
            __dest = (char *)(*Curl_cmalloc)(sVar7);
            pp->cache = __dest;
            if (__dest != (char *)0x0) {
              memcpy(__dest,pp->linestart_resp,pp->cache_size);
              goto LAB_005837ef;
            }
            local_70 = CURLE_OUT_OF_MEMORY;
            bVar2 = false;
          }
LAB_00583816:
          if (!bVar2) {
            return local_70;
          }
        }
      }
      uVar6 = pp->nread_resp;
    } while (((uVar6 < 0x4000) && (bVar8)) && (CVar5 == CURLE_OK));
  }
  pp->pending_resp = false;
  return CVar5;
}

Assistant:

CURLcode Curl_pp_readresp(curl_socket_t sockfd,
                          struct pingpong *pp,
                          int *code, /* return the server code if done */
                          size_t *size) /* size of the response */
{
  ssize_t perline; /* count bytes per line */
  bool keepon=TRUE;
  ssize_t gotbytes;
  char *ptr;
  struct connectdata *conn = pp->conn;
  struct SessionHandle *data = conn->data;
  char * const buf = data->state.buffer;
  CURLcode result = CURLE_OK;

  *code = 0; /* 0 for errors or not done */
  *size = 0;

  ptr=buf + pp->nread_resp;

  /* number of bytes in the current line, so far */
  perline = (ssize_t)(ptr-pp->linestart_resp);

  while((pp->nread_resp<BUFSIZE) && (keepon && !result)) {

    if(pp->cache) {
      /* we had data in the "cache", copy that instead of doing an actual
       * read
       *
       * pp->cache_size is cast to ssize_t here.  This should be safe, because
       * it would have been populated with something of size int to begin
       * with, even though its datatype may be larger than an int.
       */
      DEBUGASSERT((ptr+pp->cache_size) <= (buf+BUFSIZE+1));
      memcpy(ptr, pp->cache, pp->cache_size);
      gotbytes = (ssize_t)pp->cache_size;
      free(pp->cache);    /* free the cache */
      pp->cache = NULL;   /* clear the pointer */
      pp->cache_size = 0; /* zero the size just in case */
    }
    else {
#ifdef HAVE_GSSAPI
      enum protection_level prot = conn->data_prot;
      conn->data_prot = PROT_CLEAR;
#endif
      DEBUGASSERT((ptr+BUFSIZE-pp->nread_resp) <= (buf+BUFSIZE+1));
      result = Curl_read(conn, sockfd, ptr, BUFSIZE-pp->nread_resp,
                         &gotbytes);
#ifdef HAVE_GSSAPI
      DEBUGASSERT(prot  > PROT_NONE && prot < PROT_LAST);
      conn->data_prot = prot;
#endif
      if(result == CURLE_AGAIN)
        return CURLE_OK; /* return */

      if(!result && (gotbytes > 0))
        /* convert from the network encoding */
        result = Curl_convert_from_network(data, ptr, gotbytes);
      /* Curl_convert_from_network calls failf if unsuccessful */

      if(result)
        /* Set outer result variable to this error. */
        keepon = FALSE;
    }

    if(!keepon)
      ;
    else if(gotbytes <= 0) {
      keepon = FALSE;
      result = CURLE_RECV_ERROR;
      failf(data, "response reading failed");
    }
    else {
      /* we got a whole chunk of data, which can be anything from one
       * byte to a set of lines and possible just a piece of the last
       * line */
      ssize_t i;
      ssize_t clipamount = 0;
      bool restart = FALSE;

      data->req.headerbytecount += (long)gotbytes;

      pp->nread_resp += gotbytes;
      for(i = 0; i < gotbytes; ptr++, i++) {
        perline++;
        if(*ptr=='\n') {
          /* a newline is CRLF in pp-talk, so the CR is ignored as
             the line isn't really terminated until the LF comes */

          /* output debug output if that is requested */
#ifdef HAVE_GSSAPI
          if(!conn->sec_complete)
#endif
            if(data->set.verbose)
              Curl_debug(data, CURLINFO_HEADER_IN,
                         pp->linestart_resp, (size_t)perline, conn);

          /*
           * We pass all response-lines to the callback function registered
           * for "headers". The response lines can be seen as a kind of
           * headers.
           */
          result = Curl_client_write(conn, CLIENTWRITE_HEADER,
                                     pp->linestart_resp, perline);
          if(result)
            return result;

          if(pp->endofresp(conn, pp->linestart_resp, perline, code)) {
            /* This is the end of the last line, copy the last line to the
               start of the buffer and zero terminate, for old times sake */
            size_t n = ptr - pp->linestart_resp;
            memmove(buf, pp->linestart_resp, n);
            buf[n]=0; /* zero terminate */
            keepon=FALSE;
            pp->linestart_resp = ptr+1; /* advance pointer */
            i++; /* skip this before getting out */

            *size = pp->nread_resp; /* size of the response */
            pp->nread_resp = 0; /* restart */
            break;
          }
          perline=0; /* line starts over here */
          pp->linestart_resp = ptr+1;
        }
      }

      if(!keepon && (i != gotbytes)) {
        /* We found the end of the response lines, but we didn't parse the
           full chunk of data we have read from the server. We therefore need
           to store the rest of the data to be checked on the next invoke as
           it may actually contain another end of response already! */
        clipamount = gotbytes - i;
        restart = TRUE;
        DEBUGF(infof(data, "Curl_pp_readresp_ %d bytes of trailing "
                     "server response left\n",
                     (int)clipamount));
      }
      else if(keepon) {

        if((perline == gotbytes) && (gotbytes > BUFSIZE/2)) {
          /* We got an excessive line without newlines and we need to deal
             with it. We keep the first bytes of the line then we throw
             away the rest. */
          infof(data, "Excessive server response line length received, "
                "%zd bytes. Stripping\n", gotbytes);
          restart = TRUE;

          /* we keep 40 bytes since all our pingpong protocols are only
             interested in the first piece */
          clipamount = 40;
        }
        else if(pp->nread_resp > BUFSIZE/2) {
          /* We got a large chunk of data and there's potentially still
             trailing data to take care of, so we put any such part in the
             "cache", clear the buffer to make space and restart. */
          clipamount = perline;
          restart = TRUE;
        }
      }
      else if(i == gotbytes)
        restart = TRUE;

      if(clipamount) {
        pp->cache_size = clipamount;
        pp->cache = malloc(pp->cache_size);
        if(pp->cache)
          memcpy(pp->cache, pp->linestart_resp, pp->cache_size);
        else
          return CURLE_OUT_OF_MEMORY;
      }
      if(restart) {
        /* now reset a few variables to start over nicely from the start of
           the big buffer */
        pp->nread_resp = 0; /* start over from scratch in the buffer */
        ptr = pp->linestart_resp = buf;
        perline = 0;
      }

    } /* there was data */

  } /* while there's buffer left and loop is requested */

  pp->pending_resp = FALSE;

  return result;
}